

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall
JsrtDebugManager::ReportScriptCompile_TTD
          (JsrtDebugManager *this,FunctionBody *body,Utf8SourceInfo *utf8SourceInfo,
          CompileScriptException *compileException,bool notify)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  DynamicObject *object;
  JsrtDebugDocumentManager *pJVar3;
  undefined4 *puVar4;
  HeapAllocator *this_00;
  DebugDocument *this_01;
  undefined1 local_78 [8];
  TrackAllocData data;
  JsrtDebugEventObject debugEventObject;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
    JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)&data.line,scriptContext);
    object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&data.line);
    pJVar3 = GetDebugDocumentManager(this);
    if (pJVar3 == (JsrtDebugDocumentManager *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0xc1,"(debugDocumentManager != nullptr)","debugDocumentManager != nullptr"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    local_78 = (undefined1  [8])&Js::DebugDocument::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_26fb6c;
    data.filename._0_4_ = 0xc4;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_78);
    this_01 = (DebugDocument *)Memory::HeapAllocator::AllocT<true>(this_00,0x20);
    Js::DebugDocument::DebugDocument(this_01,utf8SourceInfo,body);
    Js::Utf8SourceInfo::SetDebugDocument(utf8SourceInfo,this_01);
    JsrtDebugUtils::AddSourceMetadataToObject(object,utf8SourceInfo);
    if (notify) {
      CallDebugEventCallback(this,JsDiagDebugEventSourceCompile,object,scriptContext,false);
    }
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&data.line);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportScriptCompile_TTD(Js::FunctionBody* body, Js::Utf8SourceInfo* utf8SourceInfo, CompileScriptException* compileException, bool notify)
{
    if(this->debugEventCallback == nullptr)
    {
        return;
    }

    Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

    JsrtDebugEventObject debugEventObject(scriptContext);
    Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

    JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
    Assert(debugDocumentManager != nullptr);

    // Create DebugDocument and then report JsDiagDebugEventSourceCompile event
    Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, body);
    if(debugDocument != nullptr)
    {
        utf8SourceInfo->SetDebugDocument(debugDocument);
    }

    JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

    if(notify)
    {
        this->CallDebugEventCallback(JsDiagDebugEventSourceCompile, eventDataObject, scriptContext, false /*isBreak*/);
    }
}